

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi.cpp
# Opt level: O0

void RtMidi_gc(RtMidi *midi,lua_State *L)

{
  iterator iVar1;
  bool bVar2;
  pointer ppVar3;
  _Self local_40;
  RtMidi *local_38;
  pair<RtMidi_*,_lua_State_*> local_30;
  _Self local_20;
  iterator it;
  lua_State *L_local;
  RtMidi *midi_local;
  
  local_38 = midi;
  it._M_node = (_Base_ptr)L;
  std::pair<RtMidi_*,_lua_State_*>::pair<RtMidi_*,_lua_State_*&,_true>
            (&local_30,&local_38,(lua_State **)&it);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::pair<RtMidi_*,_lua_State_*>,_int,_std::less<std::pair<RtMidi_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>_>_>
       ::find((map<std::pair<RtMidi_*,_lua_State_*>,_int,_std::less<std::pair<RtMidi_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>_>_>
               *)(anonymous_namespace)::RtMidi_callbacks,&local_30);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::pair<RtMidi_*,_lua_State_*>,_int,_std::less<std::pair<RtMidi_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>_>_>
       ::end((map<std::pair<RtMidi_*,_lua_State_*>,_int,_std::less<std::pair<RtMidi_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>_>_>
              *)(anonymous_namespace)::RtMidi_callbacks);
  bVar2 = std::operator!=(&local_20,&local_40);
  iVar1 = it;
  if (bVar2) {
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>_>::
             operator->(&local_20);
    luaL_unref(iVar1._M_node,0xfff0b9d8,ppVar3->second);
    std::
    map<std::pair<RtMidi*,lua_State*>,int,std::less<std::pair<RtMidi*,lua_State*>>,std::allocator<std::pair<std::pair<RtMidi*,lua_State*>const,int>>>
    ::erase_abi_cxx11_((map<std::pair<RtMidi*,lua_State*>,int,std::less<std::pair<RtMidi*,lua_State*>>,std::allocator<std::pair<std::pair<RtMidi*,lua_State*>const,int>>>
                        *)(anonymous_namespace)::RtMidi_callbacks,(iterator)local_20._M_node);
  }
  return;
}

Assistant:

LUA_RTMIDI_LOCAL void RtMidi_gc(RtMidi &midi, lua_State *L) {
	auto it = RtMidi_callbacks.find({&midi, L});
	if (it != RtMidi_callbacks.end()) {
		luaL_unref(L, LUA_REGISTRYINDEX, it->second);
		RtMidi_callbacks.erase(it);
	}
}